

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

int Llb_NonlinNextPartitions(Llb_Mgr_t *p,Llb_Prt_t **ppPart1,Llb_Prt_t **ppPart2)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  int iVar3;
  Llb_Var_t *pLVar4;
  Llb_Prt_t *pLVar5;
  Llb_Prt_t *pLVar6;
  long lVar7;
  long lVar8;
  Llb_Prt_t *pLVar9;
  
  Llb_NonlinCheckVars(p);
  iVar3 = 0;
  if ((long)p->nVars < 1) {
    pLVar4 = (Llb_Var_t *)0x0;
  }
  else {
    lVar7 = 0;
    pLVar4 = (Llb_Var_t *)0x0;
    do {
      pLVar1 = p->pVars[lVar7];
      if ((pLVar1 != (Llb_Var_t *)0x0) &&
         ((pLVar4 == (Llb_Var_t *)0x0 || (pLVar1->nScore < pLVar4->nScore)))) {
        pLVar4 = pLVar1;
      }
      lVar7 = lVar7 + 1;
    } while (p->nVars != lVar7);
  }
  if (pLVar4 != (Llb_Var_t *)0x0) {
    lVar7 = (long)pLVar4->vParts->nSize;
    if (lVar7 < 1) {
      pLVar6 = (Llb_Prt_t *)0x0;
      pLVar9 = (Llb_Prt_t *)0x0;
    }
    else {
      lVar8 = 0;
      pLVar9 = (Llb_Prt_t *)0x0;
      pLVar5 = (Llb_Prt_t *)0x0;
      do {
        pLVar2 = p->pParts[pLVar4->vParts->pArray[lVar8]];
        pLVar6 = pLVar2;
        if (pLVar5 != (Llb_Prt_t *)0x0) {
          if (pLVar9 != (Llb_Prt_t *)0x0) {
            if (((pLVar5->nSize <= pLVar2->nSize) &&
                (pLVar6 = pLVar5, pLVar9->nSize <= pLVar2->nSize)) ||
               (pLVar6 = pLVar2, pLVar9->nSize < pLVar5->nSize)) goto LAB_00937c3e;
          }
          pLVar6 = pLVar5;
          pLVar9 = pLVar2;
        }
LAB_00937c3e:
        lVar8 = lVar8 + 1;
        pLVar5 = pLVar6;
      } while (lVar7 != lVar8);
    }
    *ppPart1 = pLVar6;
    *ppPart2 = pLVar9;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Llb_NonlinNextPartitions( Llb_Mgr_t * p, Llb_Prt_t ** ppPart1, Llb_Prt_t ** ppPart2 )
{
    Llb_Var_t * pVar, * pVarBest = NULL;
    Llb_Prt_t * pPart, * pPart1Best = NULL, * pPart2Best = NULL;
    int i;
    Llb_NonlinCheckVars( p );
    // find variable with minimum score
    Llb_MgrForEachVar( p, pVar, i )
        if ( pVarBest == NULL || pVarBest->nScore > pVar->nScore )
            pVarBest = pVar;
    if ( pVarBest == NULL )
        return 0;
    // find two partitions with minimum size
    Llb_VarForEachPart( p, pVarBest, pPart, i )
    {
        if ( pPart1Best == NULL )
            pPart1Best = pPart;
        else if ( pPart2Best == NULL )
            pPart2Best = pPart;
        else if ( pPart1Best->nSize > pPart->nSize || pPart2Best->nSize > pPart->nSize )
        {
            if ( pPart1Best->nSize > pPart2Best->nSize )
                pPart1Best = pPart;
            else
                pPart2Best = pPart;
        }
    }
    *ppPart1 = pPart1Best;
    *ppPart2 = pPart2Best;
    return 1; 
}